

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

Abc_Cex_t * Bmc_CexEssentialBits(Gia_Man_t *p,Abc_Cex_t *pCexState,Abc_Cex_t *pCexCare,int fVerbose)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  Abc_Cex_t *pAVar4;
  uint iBit;
  Abc_Cex_t *pAVar5;
  bool bVar6;
  int fEqual;
  Abc_Cex_t *pPrev;
  int local_5c;
  Abc_Cex_t *local_58;
  Abc_Cex_t *local_50;
  Abc_Cex_t *local_48;
  int local_3c;
  Abc_Cex_t *local_38;
  
  local_58 = (Abc_Cex_t *)0x0;
  local_5c = 0;
  local_3c = fVerbose;
  if (pCexState->nBits != pCexCare->nBits) {
    __assert_fail("pCexState->nBits == pCexCare->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x2f8,
                  "Abc_Cex_t *Bmc_CexEssentialBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, int)");
  }
  bVar6 = false;
  local_50 = pCexState;
  local_38 = Abc_CexAlloc(0,p->vCis->nSize,pCexState->iFrame + 1);
  local_38->iFrame = local_50->iFrame;
  local_38->iPo = local_50->iPo;
  if (0 < local_50->nBits) {
    iBit = 0;
    pAVar5 = local_50;
    local_48 = pCexCare;
    do {
      if (((uint)(&pCexCare[1].iPo)[iBit >> 5] >> (iBit & 0x1f) & 1) == 0) goto LAB_0057ea75;
      bVar3 = bVar6;
      if ((int)iBit % pCexCare->nPis < p->vCis->nSize - p->nRegs) {
        pAVar4 = Bmc_CexEssentialBitOne(p,pAVar5,iBit,local_58,&local_5c);
        if (pAVar4 == (Abc_Cex_t *)0x0) {
          pAVar5 = local_50;
          pCexCare = local_48;
          if ((local_5c != 0) && (bVar3 = true, bVar6)) goto LAB_0057ea5f;
        }
        else {
          Abc_CexFree(local_58);
          uVar1 = pAVar5->iPo;
          iVar2 = p->vCos->nSize;
          local_58 = pAVar4;
          if (iVar2 - p->nRegs <= (int)uVar1) {
            __assert_fail("v < Gia_ManPoNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
          }
          if (((int)uVar1 < 0) || (iVar2 <= (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = p->vCos->pArray[uVar1];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          bVar6 = ((undefined1  [12])p->pObjs[iVar2] & (undefined1  [12])0x4000000000000000) ==
                  (undefined1  [12])0x0;
          pCexCare = local_48;
          bVar3 = bVar6;
          if (bVar6) goto LAB_0057ea5f;
        }
      }
      else {
LAB_0057ea5f:
        (&local_38[1].iPo)[iBit >> 5] = (&local_38[1].iPo)[iBit >> 5] | 1 << (sbyte)(iBit & 0x1f);
        bVar6 = bVar3;
      }
LAB_0057ea75:
      iBit = iBit + 1;
    } while ((int)iBit < pAVar5->nBits);
  }
  Abc_CexFreeP(&local_58);
  printf("Essentials:   ");
  pAVar5 = local_38;
  Bmc_CexPrint(local_38,p->vCis->nSize - p->nRegs,local_3c);
  return pAVar5;
}

Assistant:

Abc_Cex_t * Bmc_CexEssentialBits( Gia_Man_t * p, Abc_Cex_t * pCexState, Abc_Cex_t * pCexCare, int fVerbose )
{
    Abc_Cex_t * pNew, * pTemp, * pPrev = NULL;
    int b, fEqual = 0, fPrevStatus = 0;
//    abctime clk = Abc_Clock();
    assert( pCexState->nBits == pCexCare->nBits );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // iterate through care-bits
    for ( b = 0; b < pCexState->nBits; b++ )
    {
        // skip don't-care bits
        if ( !Abc_InfoHasBit(pCexCare->pData, b) )
            continue;

        // skip state bits
        if ( b % pCexCare->nPis >= Gia_ManPiNum(p) )
        {
            Abc_InfoSetBit( pNew->pData, b );
            continue;
        }

        // check if this is an essential bit
        pTemp = Bmc_CexEssentialBitOne( p, pCexState, b, pPrev, &fEqual );
//        pTemp = Bmc_CexEssentialBitOne( p, pCexState, b, NULL, &fEqual );
        if ( pTemp == NULL )
        {
            if ( fEqual && fPrevStatus )
                Abc_InfoSetBit( pNew->pData, b );
            continue;
        }
//        Bmc_CexPrint( pTemp, Gia_ManPiNum(p), fVerbose );
        Abc_CexFree( pPrev );
        pPrev = pTemp;

        // record essential bit
        fPrevStatus = !Gia_ManPo(p, pCexState->iPo)->fMark1;
        if ( !Gia_ManPo(p, pCexState->iPo)->fMark1 )
            Abc_InfoSetBit( pNew->pData, b );
    }
    Abc_CexFreeP( &pPrev );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    printf( "Essentials:   " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    return pNew;
}